

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1write.c
# Opt level: O0

mbedtls_asn1_named_data *
mbedtls_asn1_store_named_data
          (mbedtls_asn1_named_data **head,char *oid,size_t oid_len,uchar *val,size_t val_len)

{
  uchar *puVar1;
  mbedtls_asn1_named_data *local_40;
  mbedtls_asn1_named_data *cur;
  size_t val_len_local;
  uchar *val_local;
  size_t oid_len_local;
  char *oid_local;
  mbedtls_asn1_named_data **head_local;
  
  local_40 = mbedtls_asn1_find_named_data(*head,oid,oid_len);
  if (local_40 == (mbedtls_asn1_named_data *)0x0) {
    local_40 = (mbedtls_asn1_named_data *)calloc(1,0x40);
    if (local_40 == (mbedtls_asn1_named_data *)0x0) {
      return (mbedtls_asn1_named_data *)0x0;
    }
    (local_40->oid).len = oid_len;
    puVar1 = (uchar *)calloc(1,oid_len);
    (local_40->oid).p = puVar1;
    if ((local_40->oid).p == (uchar *)0x0) {
      free(local_40);
      return (mbedtls_asn1_named_data *)0x0;
    }
    memcpy((local_40->oid).p,oid,oid_len);
    (local_40->val).len = val_len;
    puVar1 = (uchar *)calloc(1,val_len);
    (local_40->val).p = puVar1;
    if ((local_40->val).p == (uchar *)0x0) {
      free((local_40->oid).p);
      free(local_40);
      return (mbedtls_asn1_named_data *)0x0;
    }
    local_40->next = *head;
    *head = local_40;
  }
  else if ((local_40->val).len < val_len) {
    free((local_40->val).p);
    (local_40->val).p = (uchar *)0x0;
    (local_40->val).len = val_len;
    puVar1 = (uchar *)calloc(1,val_len);
    (local_40->val).p = puVar1;
    if ((local_40->val).p == (uchar *)0x0) {
      free((local_40->oid).p);
      free(local_40);
      return (mbedtls_asn1_named_data *)0x0;
    }
  }
  if (val != (uchar *)0x0) {
    memcpy((local_40->val).p,val,val_len);
  }
  return local_40;
}

Assistant:

mbedtls_asn1_named_data *mbedtls_asn1_store_named_data( mbedtls_asn1_named_data **head,
                                        const char *oid, size_t oid_len,
                                        const unsigned char *val,
                                        size_t val_len )
{
    mbedtls_asn1_named_data *cur;

    if( ( cur = mbedtls_asn1_find_named_data( *head, oid, oid_len ) ) == NULL )
    {
        // Add new entry if not present yet based on OID
        //
        if( ( cur = mbedtls_calloc( 1, sizeof(mbedtls_asn1_named_data) ) ) == NULL )
            return( NULL );

        cur->oid.len = oid_len;
        cur->oid.p = mbedtls_calloc( 1, oid_len );
        if( cur->oid.p == NULL )
        {
            mbedtls_free( cur );
            return( NULL );
        }

        memcpy( cur->oid.p, oid, oid_len );

        cur->val.len = val_len;
        cur->val.p = mbedtls_calloc( 1, val_len );
        if( cur->val.p == NULL )
        {
            mbedtls_free( cur->oid.p );
            mbedtls_free( cur );
            return( NULL );
        }

        cur->next = *head;
        *head = cur;
    }
    else if( cur->val.len < val_len )
    {
        // Enlarge existing value buffer if needed
        //
        mbedtls_free( cur->val.p );
        cur->val.p = NULL;

        cur->val.len = val_len;
        cur->val.p = mbedtls_calloc( 1, val_len );
        if( cur->val.p == NULL )
        {
            mbedtls_free( cur->oid.p );
            mbedtls_free( cur );
            return( NULL );
        }
    }

    if( val != NULL )
        memcpy( cur->val.p, val, val_len );

    return( cur );
}